

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::GenerateBlockSyntax::GenerateBlockSyntax
          (GenerateBlockSyntax *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,
          NamedLabelSyntax *label,Token begin,NamedBlockClauseSyntax *beginName,
          SyntaxList<slang::syntax::MemberSyntax> *members,Token end,NamedBlockClauseSyntax *endName
          )

{
  pointer ppMVar1;
  size_type sVar2;
  SyntaxKind SVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  long lVar6;
  
  uVar5 = begin._0_8_;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,GenerateBlock,attributes);
  this->label = label;
  (this->begin).kind = (short)uVar5;
  (this->begin).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->begin).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->begin).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->begin).info = begin.info;
  this->beginName = beginName;
  SVar3 = (members->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar4 = *(undefined4 *)&(members->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->members).super_SyntaxListBase.super_SyntaxNode.parent =
       (members->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->members).super_SyntaxListBase.super_SyntaxNode.kind = SVar3;
  *(undefined4 *)&(this->members).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar4;
  (this->members).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_0046ff68;
  (this->members).super_SyntaxListBase.childCount = (members->super_SyntaxListBase).childCount;
  sVar2 = (members->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>).size_;
  (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.data_ =
       (members->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>).data_;
  (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.size_ = sVar2;
  (this->members).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00473020;
  (this->end).kind = end.kind;
  (this->end).field_0x2 = end._2_1_;
  (this->end).numFlags = (NumericTokenFlags)end.numFlags.raw;
  (this->end).rawLen = end.rawLen;
  (this->end).info = end.info;
  this->endName = endName;
  if (label != (NamedLabelSyntax *)0x0) {
    (label->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  if (beginName != (NamedBlockClauseSyntax *)0x0) {
    (beginName->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  (this->members).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  ppMVar1 = (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.data_;
  sVar2 = (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.size_;
  for (lVar6 = 0; sVar2 << 3 != lVar6; lVar6 = lVar6 + 8) {
    **(undefined8 **)((long)ppMVar1 + lVar6) = this;
  }
  if (endName != (NamedBlockClauseSyntax *)0x0) {
    (endName->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

GenerateBlockSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, NamedLabelSyntax* label, Token begin, NamedBlockClauseSyntax* beginName, const SyntaxList<MemberSyntax>& members, Token end, NamedBlockClauseSyntax* endName) :
        MemberSyntax(SyntaxKind::GenerateBlock, attributes), label(label), begin(begin), beginName(beginName), members(members), end(end), endName(endName) {
        if (this->label) this->label->parent = this;
        if (this->beginName) this->beginName->parent = this;
        this->members.parent = this;
        for (auto child : this->members)
            child->parent = this;
        if (this->endName) this->endName->parent = this;
    }